

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

Vector2i __thiscall sf::priv::WindowImplX11::getPrimaryMonitorPosition(WindowImplX11 *this)

{
  Vector2i VVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  RROutput RVar5;
  long lVar6;
  long lVar7;
  long in_RDI;
  XRRCrtcInfo *crtcInfo;
  XRROutputInfo *outputInfo;
  RROutput output;
  int xRandRMinor;
  int xRandRMajor;
  XRRScreenResources *res;
  Window rootWindow;
  Vector2i monitorPosition;
  undefined8 in_stack_ffffffffffffffc0;
  XRRScreenResources *in_stack_ffffffffffffffc8;
  Window *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Vector2<int> local_8;
  
  Vector2<int>::Vector2(&local_8);
  lVar3 = XRRGetScreenResources
                    (*(undefined8 *)(in_RDI + 0x3d0),
                     *(undefined8 *)
                      (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
                       (long)*(int *)(in_RDI + 0x3d8) * 0x80 + 0x10));
  if (lVar3 == 0) {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,
                             "Failed to get the current screen resources for.primary monitor position"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar2 = checkXRandR((WindowImplX11 *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (int *)in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8);
    if (!bVar2) {
      in_stack_ffffffffffffffd8 = 0;
      in_stack_ffffffffffffffdc = 0;
    }
    RVar5 = getOutputPrimary((WindowImplX11 *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                             (int)in_stack_ffffffffffffffc0);
    lVar6 = XRRGetOutputInfo(*(undefined8 *)(in_RDI + 0x3d0),lVar3,RVar5);
    if ((lVar6 == 0) || (*(short *)(lVar6 + 0x30) == 1)) {
      XRRFreeScreenResources(lVar3);
      if (lVar6 != 0) {
        XRRFreeOutputInfo(lVar6);
      }
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,"Failed to get output info for.primary monitor position");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      lVar7 = XRRGetCrtcInfo(*(undefined8 *)(in_RDI + 0x3d0),lVar3,*(undefined8 *)(lVar6 + 8));
      if (lVar7 == 0) {
        XRRFreeScreenResources(lVar3);
        XRRFreeOutputInfo(lVar6);
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,"Failed to get crtc info for.primary monitor position");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_8.x = *(int *)(lVar7 + 8);
        local_8.y = *(int *)(lVar7 + 0xc);
        XRRFreeCrtcInfo(lVar7);
        XRRFreeOutputInfo(lVar6);
        XRRFreeScreenResources(lVar3);
      }
    }
  }
  VVar1.y = local_8.y;
  VVar1.x = local_8.x;
  return VVar1;
}

Assistant:

Vector2i WindowImplX11::getPrimaryMonitorPosition()
{
    Vector2i monitorPosition;

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    // Get xRandr version
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
        xRandRMajor = xRandRMinor = 0;

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    monitorPosition.x = crtcInfo->x;
    monitorPosition.y = crtcInfo->y;

    XRRFreeCrtcInfo(crtcInfo);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeScreenResources(res);

    return monitorPosition;
}